

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::peer_connection::account_received_bytes
          (peer_connection *this,int bytes_transferred)

{
  int *piVar1;
  
  piVar1 = &(this->m_recv_buffer).m_recv_end;
  *piVar1 = *piVar1 + bytes_transferred;
  this->m_quota[1] = this->m_quota[1] - bytes_transferred;
  (*(((this->super_peer_connection_hot_members).m_ses)->super_session_logger)._vptr_session_logger
    [0x4c])();
  trancieve_ip_packet(this,bytes_transferred,(this->m_remote).impl_.data_.base.sa_family != 2);
  peer_log(this,incoming,"READ","%d bytes",bytes_transferred);
  return;
}

Assistant:

void peer_connection::account_received_bytes(int const bytes_transferred)
	{
		// tell the receive buffer we just fed it this many bytes of incoming data
		TORRENT_ASSERT(bytes_transferred > 0);
		m_recv_buffer.received(bytes_transferred);

		// update the dl quota
		TORRENT_ASSERT(bytes_transferred <= m_quota[download_channel]);
		m_quota[download_channel] -= bytes_transferred;

		// account receiver buffer size stats to the session
		m_ses.received_buffer(bytes_transferred);

		// estimate transport protocol overhead
		trancieve_ip_packet(bytes_transferred, aux::is_v6(m_remote));

#ifndef TORRENT_DISABLE_LOGGING
		peer_log(peer_log_alert::incoming, "READ"
			, "%d bytes", bytes_transferred);
#endif
	}